

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  FILE *pFVar2;
  undefined1 auVar3 [8];
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  typed_value<int,_char> *ptVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  const_iterator cVar9;
  ostream *poVar10;
  FILE *__stream;
  int *piVar11;
  FILE *__stream_00;
  __ssize_t _Var12;
  vw *all;
  size_t sVar13;
  char *line;
  example *ec;
  size_t len;
  char *u;
  string str;
  char *i;
  char *buf;
  options_description desc;
  variables_map vm;
  allocator local_22a;
  allocator local_229;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  undefined1 local_218 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  char *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  pointer local_1c8;
  pointer local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_190 [24];
  void *local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_150 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  local_228 = (undefined1  [8])local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_1b8,(string *)local_228,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_228 != (undefined1  [8])local_218) {
    operator_delete((void *)local_228);
  }
  local_228 = (undefined1  [8])boost::program_options::options_description::add_options();
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_228,"help,h");
  ptVar7 = boost::program_options::value<int>(&topk);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"topk",(char *)ptVar7);
  ptVar7 = boost::program_options::value<int>(&verbose);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"verbose,v",(char *)ptVar7);
  ptVar7 = boost::program_options::value<int>(&b);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"bf_bits,b",(char *)ptVar7);
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&blacklistfilename_abi_cxx11_);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"blacklist,B",(char *)ptVar8);
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&userfilename_abi_cxx11_);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"users,U",(char *)ptVar8);
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&itemfilename_abi_cxx11_);
  pcVar6 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar6,(value_semantic *)"items,I",(char *)ptVar8);
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&vwparams_abi_cxx11_);
  boost::program_options::options_description_easy_init::operator()
            (pcVar6,(value_semantic *)"vwparams",(char *)ptVar8);
  local_f8.super_function_base.vtable = (vtable_base *)0x0;
  local_f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_f8.super_function_base.functor._8_8_ = 0;
  local_f8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_228,argc,argv,(options_description *)local_1b8,0,
             &local_f8);
  boost::program_options::store((basic_parsed_options *)local_228,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_228);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_f8);
  boost::program_options::notify((variables_map *)local_d0);
  local_228 = (undefined1  [8])local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"help","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_228);
  if (local_228 != (undefined1  [8])local_218) {
    operator_delete((void *)local_228);
  }
  if (cVar9._M_node != &local_b8) {
    poVar10 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cout,(options_description *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_150);
    if (local_178 != (void *)0x0) {
      operator_delete(local_178);
      local_178 = (void *)0x0;
      local_170 = 0;
      local_168 = 0;
      local_160 = 0;
      local_158 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_190);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    local_d0[0] = std::__cxx11::istringstream::istringstream;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::~_Rb_tree(local_c0);
    return 1;
  }
  if ((((blacklistfilename_abi_cxx11_._M_string_length == 0) ||
       (userfilename_abi_cxx11_._M_string_length == 0)) ||
      (itemfilename_abi_cxx11_._M_string_length == 0)) ||
     (vwparams_abi_cxx11_._M_string_length == 0)) {
    poVar10 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cout,(options_description *)local_1b8);
    std::operator<<(poVar10,"\n");
  }
  else {
    __stream = fopen64(blacklistfilename_abi_cxx11_._M_dataplus._M_p,"r");
    pFVar2 = _stderr;
    _Var1 = blacklistfilename_abi_cxx11_._M_dataplus;
    if (__stream == (FILE *)0x0) {
      piVar11 = __errno_location();
      pcVar6 = strerror(*piVar11);
      fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar6);
      poVar10 = (ostream *)
                boost::program_options::operator<<
                          ((ostream *)&std::cerr,(options_description *)local_1b8);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    else {
      __stream_00 = fopen64(userfilename_abi_cxx11_._M_dataplus._M_p,"r");
      pFVar2 = _stderr;
      _Var1 = userfilename_abi_cxx11_._M_dataplus;
      if (__stream_00 == (FILE *)0x0) {
        piVar11 = __errno_location();
        pcVar6 = strerror(*piVar11);
        fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar6);
        poVar10 = (ostream *)
                  boost::program_options::operator<<
                            ((ostream *)&std::cerr,(options_description *)local_1b8);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      else {
        local_200._M_allocated_capacity =
             (size_type)fopen64(itemfilename_abi_cxx11_._M_dataplus._M_p,"r");
        pFVar2 = _stderr;
        _Var1 = itemfilename_abi_cxx11_._M_dataplus;
        if ((FILE *)local_200._M_allocated_capacity != (FILE *)0x0) {
          local_1c0 = (pointer)0x0;
          local_1f0 = (char *)0x0;
          local_1c8 = (pointer)0x0;
          local_200._8_8_ = 0;
          if (0 < verbose) {
            main_cold_1();
          }
          pcVar6 = (char *)calloc(1,((ulong)(1L << ((byte)b & 0x3f)) >> 3) + (ulong)((uint)b < 3));
          while (_Var12 = getline((char **)&local_1c0,(size_t *)(local_200._M_local_buf + 8),
                                  __stream), _Var12 != -1) {
            bf_add(pcVar6,(char *)local_1c0);
            banned = banned + 1;
          }
          if (verbose != 0) {
            main_cold_2();
          }
          if (0 < verbose) {
            main_cold_3();
          }
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,vwparams_abi_cxx11_._M_dataplus._M_p,
                     vwparams_abi_cxx11_._M_dataplus._M_p + vwparams_abi_cxx11_._M_string_length);
          all = VW::initialize(&local_118,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (0 < verbose) {
            main_cold_4();
          }
          line = (char *)0x0;
          do {
            _Var12 = getline(&local_1f0,(size_t *)(local_200._M_local_buf + 8),__stream_00);
            pcVar4 = local_1f0;
            if (_Var12 == -1) {
              if (0 < verbose) {
                progress();
              }
              VW::finish(all,true);
              fclose((FILE *)local_200._M_allocated_capacity);
              fclose(__stream_00);
              exit(0);
            }
            users = users + 1;
            sVar13 = strlen(local_1f0);
            pcVar4[sVar13 - 1] = '\0';
            rewind((FILE *)local_200._M_allocated_capacity);
            items = 0;
            while (_Var12 = getline((char **)&local_1c8,(size_t *)(local_200._M_local_buf + 8),
                                    (FILE *)local_200._M_allocated_capacity), _Var12 != -1) {
              items = items + 1;
              pairs = pairs + 1;
              if ((0 < verbose) && (pairs % show == 0)) {
                main_cold_5();
              }
              free(line);
              std::__cxx11::string::string((string *)&local_1e8,local_1f0,&local_229);
              std::__cxx11::string::string((string *)&local_138,(char *)local_1c8,&local_22a);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_228,&local_1e8,&local_138);
              auVar3 = local_228;
              line = strdup((char *)local_228);
              if (auVar3 != (undefined1  [8])local_218) {
                operator_delete((void *)auVar3);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p);
              }
              iVar5 = bf_hit(pcVar6,line);
              if (iVar5 == 0) {
                ec = VW::read_example(all,line);
                vw::learn(all,ec);
                std::__cxx11::string::string((string *)&local_1e8,line,(allocator *)local_228);
                if ((ulong)(((long)pr_queue_abi_cxx11_.c.
                                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)pr_queue_abi_cxx11_.c.
                                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333) < (ulong)(long)topk) {
                  local_228._0_4_ = (ec->pred).multiclass;
                  local_220._M_p = local_218 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,local_1e8._M_dataplus._M_p,
                             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::push(&pr_queue_abi_cxx11_,(value_type *)local_228);
LAB_001192da:
                  if ((pointer)local_220._M_p != (pointer)(local_218 + 8)) {
                    operator_delete(local_220._M_p);
                  }
                }
                else if ((pr_queue_abi_cxx11_.c.
                          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first <= (ec->pred).scalar &&
                         (ec->pred).scalar !=
                         (pr_queue_abi_cxx11_.c.
                          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first) {
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::pop(&pr_queue_abi_cxx11_);
                  local_228._0_4_ = (ec->pred).multiclass;
                  local_220._M_p = local_218 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_220,local_1e8._M_dataplus._M_p,
                             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
                  std::
                  priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
                  ::push(&pr_queue_abi_cxx11_,(value_type *)local_228);
                  goto LAB_001192da;
                }
                VW::finish_example(all,ec);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p);
                }
              }
              else {
                skipped = skipped + 1;
                if (1 < verbose) {
                  fprintf(_stderr,"skipping:#%s#\n",line);
                }
              }
            }
            while (pr_queue_abi_cxx11_.c.
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   pr_queue_abi_cxx11_.c.
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
              poVar10 = std::ostream::_M_insert<double>
                                  ((double)(pr_queue_abi_cxx11_.c.
                                            super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\t",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,((pr_queue_abi_cxx11_.c.
                                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus.
                                 _M_p,
                         ((pr_queue_abi_cxx11_.c.
                           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length);
              std::
              priority_queue<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_compare_scored_examples>
              ::pop(&pr_queue_abi_cxx11_);
              recs = recs + 1;
            }
          } while( true );
        }
        piVar11 = __errno_location();
        pcVar6 = strerror(*piVar11);
        fprintf(pFVar2,"can\'t open %s: %s\n",_Var1._M_p,pcVar6);
        poVar10 = (ostream *)
                  boost::program_options::operator<<
                            ((ostream *)&std::cerr,(options_description *)local_1b8);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
  }
  exit(2);
}

Assistant:

int main(int argc, char *argv[])
{ po::variables_map vm;
  po::options_description desc("Allowed options");
  desc.add_options()
  ("help,h", "produce help message")
  ("topk", po::value<int>(&topk), "number of items to recommend per user")
  ("verbose,v", po::value<int>(&verbose), "increase verbosity (can be repeated)")
  ("bf_bits,b", po::value<int>(&b), "number of items to recommend")
  ("blacklist,B", po::value<string>(&blacklistfilename), "user item pairs (in vw format) that we should not recommend (have been seen before)")
  ("users,U", po::value<string>(&userfilename), "users portion in vw format to make recs for")
  ("items,I", po::value<string>(&itemfilename), "items (in vw format) to recommend from")
  ("vwparams", po::value<string>(&vwparams), "vw parameters for model instantiation (-i model ...)")
  ;

  try
  { po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);
  }
  catch(exception & e)
  { cout << endl << argv[0] << ": " << e.what() << endl << endl << desc << endl;
    exit(2);
  }

  if (vm.count("help"))
  { cout << desc << "\n";
    return 1;
  }

  if (blacklistfilename.empty() || userfilename.empty() || itemfilename.empty() || vwparams.empty())
  { cout << desc << "\n";
    exit(2);
  }

  FILE * fB;
  FILE * fU;
  FILE * fI;

  if((fB = fopen(blacklistfilename.c_str(), "r")) == NULL)
  { fprintf(stderr,"can't open %s: %s\n", blacklistfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fU = fopen(userfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", userfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }
  if((fI = fopen(itemfilename.c_str(), "r")) == NULL )
  { fprintf(stderr,"can't open %s: %s\n", itemfilename.c_str(), strerror(errno));
    cerr << desc << endl;
    exit(2);
  }

  char * buf = NULL;
  char * u = NULL;
  char * i = NULL;
  size_t len = 0;
  ssize_t read;

  /* make the bloom filter */
  if(verbose>0)
    fprintf(stderr, "loading blacklist into bloom filter...\n");
  char *bf= bf_new(b);

  /* loop over the source file */
  while ((read = getline(&buf,&len,fB)) != -1)
  { bf_add(bf,buf);
    banned++;
  }

  /* print saturation etc */
  if (verbose)
  { bf_info(bf,stderr);
    fprintf(stderr, "%d banned pairs\n", banned);
  }

  // INITIALIZE WITH WHATEVER YOU WOULD PUT ON THE VW COMMAND LINE
  if(verbose>0)
    fprintf(stderr, "initializing vw...\n");
  vw* model = VW::initialize(vwparams);

  char * estr = NULL;

  if(verbose>0)
  { fprintf(stderr, "predicting...\n");
    fprintf(stderr, "%12s %8s %8s %8s %12s %s %s\n", "pair", "user", "item", "rec", "skipped", "userfile", "itemfile");
  }
  while ((read = getline(&u, &len, fU)) != -1)
  { users++;
    u[strlen(u)-1] = 0; // chop
    rewind(fI);
    items=0;
    while ((read = getline(&i, &len, fI)) != -1)
    { items++;
      pairs++;

      if((verbose > 0) & (pairs % show == 0))
      { progress();
        show *= 2;
      }

      free(estr);
      estr = strdup((string(u)+string(i)).c_str());

      if (!bf_hit(bf,estr))
      { example *ex = VW::read_example(*model, estr);
        model->learn(*ex);

        const string str(estr);

        if(pr_queue.size() < (size_t)topk)
        { pr_queue.push(make_pair(ex->pred.scalar, str));
        }
        else if(pr_queue.top().first < ex->pred.scalar)
        { pr_queue.pop();
          pr_queue.push(make_pair(ex->pred.scalar, str));
        }

        VW::finish_example(*model, *ex);
      }
      else
      { skipped++;
        if(verbose>=2)
          fprintf(stderr,"skipping:#%s#\n", estr);
      }

    }

    while(!pr_queue.empty())
    { cout << pr_queue.top().first << "\t" << pr_queue.top().second;
      pr_queue.pop();
      recs++;
    }
  }
  if(verbose>0)
  { progress();
  }

  VW::finish(*model);
  fclose(fI);
  fclose(fU);
  exit(EXIT_SUCCESS);

}